

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

ggml_backend_buffer_t
ggml_backend_buffer_init
          (ggml_backend_buffer_type_t buft,ggml_backend_buffer_i iface,void *context,size_t size)

{
  ggml_backend_buffer_t __dest;
  size_t in_RDX;
  void *in_RSI;
  ggml_backend_buffer_type_t in_RDI;
  ggml_backend_buffer_t buffer;
  
  __dest = (ggml_backend_buffer_t)operator_new(0x68);
  memcpy(__dest,&stack0x00000008,0x48);
  __dest->buft = in_RDI;
  __dest->context = in_RSI;
  __dest->size = in_RDX;
  __dest->usage = GGML_BACKEND_BUFFER_USAGE_ANY;
  return __dest;
}

Assistant:

ggml_backend_buffer_t ggml_backend_buffer_init(
               ggml_backend_buffer_type_t buft,
        struct ggml_backend_buffer_i      iface,
               void *                     context,
               size_t                     size) {
    ggml_backend_buffer_t buffer = new ggml_backend_buffer {
        /* .interface = */ iface,
        /* .buft      = */ buft,
        /* .context   = */ context,
        /* .size      = */ size,
        /* .usage     = */ GGML_BACKEND_BUFFER_USAGE_ANY
    };

    return buffer;
}